

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::calcAccelerationDeltasMultiDof
          (btMultiBody *this,btScalar *force,btScalar *output,btAlignedObjectArray<float> *scratch_r
          ,btAlignedObjectArray<btVector3> *scratch_v)

{
  btSpatialForceVector *v;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  btSpatialForceVector *outVec;
  btMatrix3x3 *this_00;
  btVector3 *pbVar5;
  int iVar6;
  long lVar7;
  btVector3 *pbVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  int dof_2;
  btSpatialForceVector *b;
  btScalar *pbVar12;
  btMultibodyLink *pbVar13;
  btSpatialTransformationMatrix *this_01;
  ulong uVar14;
  int dof2;
  ulong uVar15;
  int dof;
  long lVar16;
  ulong uVar17;
  btMultiBody *outVec_00;
  int dof_1;
  long lVar18;
  btScalar bVar19;
  float fVar20;
  btScalar bVar21;
  btScalar bVar22;
  btScalar bVar23;
  btVector3 bVar24;
  long local_c0;
  btMatrix3x3 local_60;
  
  uVar2 = (this->m_links).m_size;
  local_60.m_el[0].m_floats._0_8_ = local_60.m_el[0].m_floats._0_8_ & 0xffffffff00000000;
  btAlignedObjectArray<float>::resize(scratch_r,this->m_dofCount,(float *)&local_60);
  btAlignedObjectArray<btVector3>::resize(scratch_v,uVar2 * 4 + 4,local_60.m_el);
  lVar7 = (long)this->m_dofCount;
  outVec = (btSpatialForceVector *)scratch_v->m_data;
  pfVar9 = scratch_r->m_data;
  if (lVar7 == 0) {
    pfVar9 = (float *)0x0;
  }
  this_00 = (this->m_matrixBuf).m_data;
  pbVar8 = (btVector3 *)((this->m_realBuf).m_data + lVar7 + 6);
  pbVar5 = (this->m_vectorBuf).m_data;
  if (lVar7 < 1) {
    pbVar8 = (btVector3 *)0x0;
    pbVar5 = (btVector3 *)0x0;
  }
  if ((calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
       ::result == '\0') &&
     (iVar6 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                   ::result), iVar6 != 0)) {
    calcAccelerationDeltasMultiDof::result.m_bottomVec.m_floats = (btScalar  [4])ZEXT816(0);
    calcAccelerationDeltasMultiDof::result.m_topVec.m_floats = (btScalar  [4])ZEXT816(0);
    __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                         ::result);
  }
  if ((calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
       ::spatForceVecTemps == '\0') &&
     (iVar6 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                   ::spatForceVecTemps), iVar6 != 0)) {
    memset(calcAccelerationDeltasMultiDof::spatForceVecTemps,0,0xc0);
    __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                         ::spatForceVecTemps);
  }
  if ((calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
       ::fromParent == '\0') &&
     (iVar6 = __cxa_guard_acquire(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                                   ::fromParent), iVar6 != 0)) {
    __cxa_guard_release(&calcAccelerationDeltasMultiDof(float_const*,float*,btAlignedObjectArray<float>&,btAlignedObjectArray<btVector3>&)
                         ::fromParent);
  }
  if (this->m_fixedBase == true) {
    (outVec->m_bottomVec).m_floats[0] = 0.0;
    (outVec->m_bottomVec).m_floats[1] = 0.0;
    (outVec->m_bottomVec).m_floats[2] = 0.0;
    (outVec->m_bottomVec).m_floats[3] = 0.0;
    (outVec->m_topVec).m_floats[0] = 0.0;
    (outVec->m_topVec).m_floats[1] = 0.0;
    (outVec->m_topVec).m_floats[2] = 0.0;
    (outVec->m_topVec).m_floats[3] = 0.0;
  }
  else {
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
         *&this_00->m_el[0].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
         *&this_00->m_el[1].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
         *&this_00->m_el[2].m_floats;
    local_60.m_el[1].m_floats[2] = -force[2];
    local_60.m_el[1].m_floats._0_8_ = *(ulong *)force ^ 0x8000000080000000;
    local_60.m_el[1].m_floats[3] = 0.0;
    local_60.m_el[0].m_floats[2] = -force[5];
    local_60.m_el[0].m_floats._0_8_ = *(ulong *)(force + 3) ^ 0x8000000080000000;
    local_60.m_el[0].m_floats[3] = 0.0;
    btSpatialTransformationMatrix::transformRotationOnly<btSpatialForceVector>
              (&calcAccelerationDeltasMultiDof::fromParent,(btSpatialForceVector *)&local_60,outVec,
               None);
  }
  lVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  v = outVec + (long)(int)uVar2 + 1;
  for (; uVar10 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
    puVar1 = (undefined8 *)((long)outVec[1].m_bottomVec.m_floats + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)outVec[1].m_topVec.m_floats + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  lVar7 = (ulong)uVar2 * 600 + -0x1d0;
  uVar11 = (ulong)uVar2;
  while (0 < (int)uVar11) {
    uVar17 = uVar11 - 1;
    pbVar13 = (this->m_links).m_data;
    iVar6 = pbVar13[uVar17].m_parent;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
         *&this_00[uVar11].m_el[0].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
         *&this_00[uVar11].m_el[1].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
         *&this_00[uVar11].m_el[2].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
         *&pbVar13[uVar17].m_cachedRVector.m_floats;
    b = outVec + uVar11;
    lVar16 = 0;
    lVar18 = lVar7;
    while( true ) {
      uVar3 = pbVar13[uVar17].m_dofCount;
      iVar4 = pbVar13[uVar17].m_dofOffset;
      if ((int)uVar3 <= lVar16) break;
      fVar20 = force[iVar4 + (int)lVar16 + 6];
      bVar19 = btSpatialMotionVector::dot
                         ((btSpatialMotionVector *)
                          ((long)(pbVar13->m_inertiaLocal).m_floats + lVar18 + -4),b);
      pbVar13 = (this->m_links).m_data;
      pfVar9[pbVar13[uVar17].m_dofOffset + lVar16] = fVar20 - bVar19;
      lVar16 = lVar16 + 1;
      lVar18 = lVar18 + 0x20;
    }
    pbVar12 = pbVar8->m_floats + (uint)(iVar4 * iVar4);
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
      calcAccelerationDeltasMultiDof::invD_times_Y[uVar14] = 0.0;
      fVar20 = 0.0;
      for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
        fVar20 = fVar20 + pbVar12[uVar15] * pfVar9[(long)iVar4 + uVar15];
        calcAccelerationDeltasMultiDof::invD_times_Y[uVar14] = fVar20;
      }
      pbVar12 = pbVar12 + (int)uVar3;
    }
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_topVec.m_floats =
         *&(b->m_topVec).m_floats;
    calcAccelerationDeltasMultiDof::spatForceVecTemps[0].m_bottomVec.m_floats =
         *&(b->m_bottomVec).m_floats;
    pbVar12 = calcAccelerationDeltasMultiDof::invD_times_Y;
    for (lVar18 = 0; lVar18 < pbVar13[uVar17].m_dofCount; lVar18 = lVar18 + 1) {
      btSpatialForceVector::operator*
                ((btSpatialForceVector *)&local_60,
                 (btSpatialForceVector *)(pbVar5 + (pbVar13[uVar17].m_dofOffset + lVar18) * 2),
                 pbVar12);
      btSpatialForceVector::operator+=
                (calcAccelerationDeltasMultiDof::spatForceVecTemps,(btSpatialForceVector *)&local_60
                );
      pbVar13 = (this->m_links).m_data;
      pbVar12 = pbVar12 + 1;
    }
    btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
              (&calcAccelerationDeltasMultiDof::fromParent,
               calcAccelerationDeltasMultiDof::spatForceVecTemps,
               calcAccelerationDeltasMultiDof::spatForceVecTemps + 1,None);
    btSpatialForceVector::operator+=
              (outVec + (long)iVar6 + 1,calcAccelerationDeltasMultiDof::spatForceVecTemps + 1);
    lVar7 = lVar7 + -600;
    uVar11 = uVar17;
  }
  if (this->m_fixedBase == false) {
    solveImatrix(this,outVec,&calcAccelerationDeltasMultiDof::result);
    btSpatialMotionVector::operator-
              ((btSpatialMotionVector *)&local_60,&calcAccelerationDeltasMultiDof::result);
    *(undefined8 *)(v->m_bottomVec).m_floats = local_60.m_el[1].m_floats._0_8_;
    *(ulong *)((v->m_bottomVec).m_floats + 2) =
         CONCAT44(local_60.m_el[1].m_floats[3],local_60.m_el[1].m_floats[2]);
    bVar19 = local_60.m_el[0].m_floats[0];
    bVar21 = local_60.m_el[0].m_floats[1];
    bVar22 = local_60.m_el[0].m_floats[2];
    bVar23 = local_60.m_el[0].m_floats[3];
  }
  else {
    (v->m_bottomVec).m_floats[0] = 0.0;
    (v->m_bottomVec).m_floats[1] = 0.0;
    (v->m_bottomVec).m_floats[2] = 0.0;
    (v->m_bottomVec).m_floats[3] = 0.0;
    bVar19 = 0.0;
    bVar21 = 0.0;
    bVar22 = 0.0;
    bVar23 = 0.0;
  }
  (v->m_topVec).m_floats[0] = bVar19;
  (v->m_topVec).m_floats[1] = bVar21;
  (v->m_topVec).m_floats[2] = bVar22;
  (v->m_topVec).m_floats[3] = bVar23;
  local_c0 = 0x88;
  uVar11 = 0;
  while (uVar11 != uVar10) {
    pbVar13 = (this->m_links).m_data;
    uVar17 = uVar11 + 1;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[0].m_floats =
         *&this_00[uVar17].m_el[0].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[1].m_floats =
         *&this_00[uVar17].m_el[1].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_rotMat.m_el[2].m_floats =
         *&this_00[uVar17].m_el[2].m_floats;
    calcAccelerationDeltasMultiDof::fromParent.m_trnVec.m_floats =
         *&pbVar13[uVar11].m_cachedRVector.m_floats;
    outVec_00 = (btMultiBody *)(v + uVar17);
    this_01 = &calcAccelerationDeltasMultiDof::fromParent;
    btSpatialTransformationMatrix::transform<btSpatialMotionVector>
              (&calcAccelerationDeltasMultiDof::fromParent,
               (btSpatialMotionVector *)
               (outVec + (long)(int)uVar2 + (long)pbVar13[uVar11].m_parent + 2),
               (btSpatialMotionVector *)outVec_00,None);
    pbVar12 = calcAccelerationDeltasMultiDof::Y_minus_hT_a;
    lVar7 = 0;
    while( true ) {
      pbVar13 = (this->m_links).m_data;
      iVar6 = pbVar13[uVar11].m_dofCount;
      iVar4 = pbVar13[uVar11].m_dofOffset;
      if (iVar6 <= lVar7) break;
      lVar18 = (long)(iVar4 + (int)lVar7);
      fVar20 = pfVar9[lVar18];
      this_01 = (btSpatialTransformationMatrix *)outVec_00;
      bVar19 = btSpatialMotionVector::dot
                         ((btSpatialMotionVector *)outVec_00,
                          (btSpatialForceVector *)(pbVar5 + lVar18 * 2));
      *pbVar12 = fVar20 - bVar19;
      lVar7 = lVar7 + 1;
      pbVar12 = pbVar12 + 1;
    }
    mulMatrix((btMultiBody *)this_01,pbVar8->m_floats + (uint)(iVar4 * iVar4),
              calcAccelerationDeltasMultiDof::Y_minus_hT_a,iVar6,iVar6,iVar6,1,
              output + (long)iVar4 + 6);
    lVar7 = local_c0;
    for (lVar18 = 0; pbVar13 = (this->m_links).m_data, lVar18 < pbVar13[uVar11].m_dofCount;
        lVar18 = lVar18 + 1) {
      btSpatialMotionVector::operator*
                ((btSpatialMotionVector *)&local_60,
                 (btSpatialMotionVector *)((long)(pbVar13->m_inertiaLocal).m_floats + lVar7 + -4),
                 output + pbVar13[uVar11].m_dofOffset + lVar18 + 6);
      btSpatialMotionVector::operator+=
                ((btSpatialMotionVector *)outVec_00,(btSpatialMotionVector *)&local_60);
      lVar7 = lVar7 + 0x20;
    }
    local_c0 = local_c0 + 600;
    uVar11 = uVar17;
  }
  btMatrix3x3::transpose(&local_60,this_00);
  bVar24 = operator*(&local_60,&v->m_topVec);
  *(long *)output = bVar24.m_floats._0_8_;
  output[2] = bVar24.m_floats[2];
  btMatrix3x3::transpose(&local_60,this_00);
  bVar24 = operator*(&local_60,&outVec[(long)(int)uVar2 + 1].m_bottomVec);
  *(long *)(output + 3) = bVar24.m_floats._0_8_;
  output[5] = bVar24.m_floats[2];
  return;
}

Assistant:

void btMultiBody::calcAccelerationDeltasMultiDof(const btScalar *force, btScalar *output,
                                       btAlignedObjectArray<btScalar> &scratch_r, btAlignedObjectArray<btVector3> &scratch_v) const
{
    // Temporary matrices/vectors -- use scratch space from caller
    // so that we don't have to keep reallocating every frame

	
	int num_links = getNumLinks();	
    scratch_r.resize(m_dofCount);
    scratch_v.resize(4*num_links + 4);	    

    btScalar * r_ptr = m_dofCount ? &scratch_r[0] : 0;
    btVector3 * v_ptr = &scratch_v[0];

    // zhat_i^A (scratch space)
    btSpatialForceVector * zeroAccSpatFrc = (btSpatialForceVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // rot_from_parent (cached from calcAccelerations)
    const btMatrix3x3 * rot_from_parent = &m_matrixBuf[0];

    // hhat (cached), accel (scratch)
    // hhat is NOT stored for the base (but ahat is) 
	const btSpatialForceVector * h = (btSpatialForceVector *)(m_dofCount > 0 ? &m_vectorBuf[0] : 0);
	btSpatialMotionVector * spatAcc = (btSpatialMotionVector *)v_ptr;
	v_ptr += num_links * 2 + 2;

    // Y_i (scratch), invD_i (cached)
    const btScalar * invD = m_dofCount > 0 ? &m_realBuf[6 + m_dofCount] : 0;
	btScalar * Y = r_ptr; 
	////////////////
	//aux variables
	static btScalar invD_times_Y[6];							//D^{-1} * Y [dofxdof x dofx1 = dofx1] <=> D^{-1} * u; better moved to buffers since it is recalced in calcAccelerationDeltasMultiDof; num_dof of btScalar would cover all bodies
	static btSpatialMotionVector result;							//holds results of the SolveImatrix op; it is a spatial motion vector (accel)
	static btScalar Y_minus_hT_a[6];							//Y - h^{T} * a; it's dofx1 for each body so a single 6x1 temp is enough	
	static btSpatialForceVector spatForceVecTemps[6];				//6 temporary spatial force vectors
	static btSpatialTransformationMatrix fromParent;	
	/////////////////

    // First 'upward' loop.
    // Combines CompTreeLinkVelocities and InitTreeLinks from Mirtich.
	
	// Fill in zero_acc
    // -- set to force/torque on the base, zero otherwise
    if (m_fixedBase) 
	{
        zeroAccSpatFrc[0].setZero();
    } else 
	{	
		//test forces
		fromParent.m_rotMat = rot_from_parent[0];
		fromParent.transformRotationOnly(btSpatialForceVector(-force[0],-force[1],-force[2], -force[3],-force[4],-force[5]), zeroAccSpatFrc[0]);
    }
    for (int i = 0; i < num_links; ++i) 
	{
		zeroAccSpatFrc[i+1].setZero();
    }    

	// 'Downward' loop.
    // (part of TreeForwardDynamics in Mirtich.)
    for (int i = num_links - 1; i >= 0; --i)
	{
		const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			Y[m_links[i].m_dofOffset + dof] = force[6 + m_links[i].m_dofOffset + dof]
											- m_links[i].m_axes[dof].dot(zeroAccSpatFrc[i+1])
											;
		}

		btVector3 in_top, in_bottom, out_top, out_bottom;
		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			invD_times_Y[dof] = 0.f;

			for(int dof2 = 0; dof2 < m_links[i].m_dofCount; ++dof2)
			{
				invD_times_Y[dof] += invDi[dof * m_links[i].m_dofCount + dof2] * Y[m_links[i].m_dofOffset + dof2];				
			}	
		}
		
		 // Zp += pXi * (Zi + hi*Yi/Di)
		spatForceVecTemps[0] = zeroAccSpatFrc[i+1];

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//
			spatForceVecTemps[0] += hDof * invD_times_Y[dof];		
		}
		

		fromParent.transformInverse(spatForceVecTemps[0], spatForceVecTemps[1]);
			
		zeroAccSpatFrc[parent+1] += spatForceVecTemps[1];
    }
	
	// ptr to the joint accel part of the output
    btScalar * joint_accel = output + 6;


    // Second 'upward' loop
    // (part of TreeForwardDynamics in Mirtich)

    if (m_fixedBase) 
	{
        spatAcc[0].setZero();
    } 
	else 
	{
		solveImatrix(zeroAccSpatFrc[0], result);
		spatAcc[0] = -result;

    }
	
    // now do the loop over the m_links
    for (int i = 0; i < num_links; ++i)
	{
        const int parent = m_links[i].m_parent;
		fromParent.m_rotMat = rot_from_parent[i+1]; fromParent.m_trnVec = m_links[i].m_cachedRVector;

		fromParent.transform(spatAcc[parent+1], spatAcc[i+1]);
		
		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)
		{
			const btSpatialForceVector &hDof = h[m_links[i].m_dofOffset + dof];
			//			
			Y_minus_hT_a[dof] = Y[m_links[i].m_dofOffset + dof] - spatAcc[i+1].dot(hDof);
		}

		const btScalar *invDi = &invD[m_links[i].m_dofOffset*m_links[i].m_dofOffset];
		mulMatrix(const_cast<btScalar*>(invDi), Y_minus_hT_a, m_links[i].m_dofCount, m_links[i].m_dofCount, m_links[i].m_dofCount, 1, &joint_accel[m_links[i].m_dofOffset]);

		for(int dof = 0; dof < m_links[i].m_dofCount; ++dof)		
			spatAcc[i+1] += m_links[i].m_axes[dof] * joint_accel[m_links[i].m_dofOffset + dof];      
    }

    // transform base accelerations back to the world frame.
    btVector3 omegadot_out;
    omegadot_out = rot_from_parent[0].transpose() * spatAcc[0].getAngular();
	output[0] = omegadot_out[0];
	output[1] = omegadot_out[1];
	output[2] = omegadot_out[2];

    btVector3 vdot_out;
    vdot_out = rot_from_parent[0].transpose() * spatAcc[0].getLinear();
	output[3] = vdot_out[0];
	output[4] = vdot_out[1];
	output[5] = vdot_out[2];

	/////////////////
	//printf("delta = [");
	//for(int dof = 0; dof < getNumDofs() + 6; ++dof)
	//	printf("%.2f ", output[dof]);
	//printf("]\n");
	/////////////////
}